

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O2

void __thiscall adios2::core::engine::BP5Writer::InitParameters(BP5Writer *this)

{
  uint uVar1;
  ulong uVar2;
  uint v;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  ulong uVar6;
  uint v_1;
  uint uVar7;
  bool bVar8;
  
  BP5Engine::ParseParams
            (&this->super_BP5Engine,(this->super_Engine).m_IO,&(this->super_BP5Engine).m_Parameters)
  ;
  bVar8 = (this->super_BP5Engine).m_Parameters.BurstBufferPath._M_string_length != 0;
  this->m_WriteToBB = bVar8;
  bVar5 = (this->super_BP5Engine).m_Parameters.BurstBufferDrain;
  if (!bVar8) {
    bVar5 = false;
  }
  this->m_DrainBB = bVar5;
  uVar3 = helper::Comm::Size(&(this->super_Engine).m_Comm);
  uVar4 = (this->super_BP5Engine).m_Parameters.NumAggregators;
  uVar7 = (this->super_BP5Engine).m_Parameters.AggregatorRatio;
  if (uVar3 <= uVar4) {
    uVar4 = uVar3;
  }
  (this->super_BP5Engine).m_Parameters.NumAggregators = uVar4;
  uVar1 = (this->super_BP5Engine).m_Parameters.NumSubFiles;
  if (uVar3 <= uVar1) {
    uVar1 = uVar3;
  }
  if (uVar3 <= uVar7) {
    uVar7 = uVar3;
  }
  (this->super_BP5Engine).m_Parameters.AggregatorRatio = uVar7;
  if (uVar4 == 0) {
    if (uVar7 == 0) {
      uVar4 = uVar1;
      if (uVar1 == 0) {
        uVar4 = 0;
        goto LAB_004c79c2;
      }
    }
    else {
      uVar4 = uVar3 / uVar7;
    }
    (this->super_BP5Engine).m_Parameters.NumAggregators = uVar4;
  }
LAB_004c79c2:
  if (uVar1 < uVar4) {
    uVar4 = uVar1;
  }
  (this->super_BP5Engine).m_Parameters.NumSubFiles = uVar4;
  uVar4 = (this->super_BP5Engine).m_Parameters.StripeSize;
  uVar7 = 0x4000000;
  if (uVar4 < 0x4000000) {
    uVar7 = uVar4;
  }
  uVar3 = 0x1000;
  if (uVar4 != 0) {
    uVar3 = uVar7;
  }
  (this->super_BP5Engine).m_Parameters.StripeSize = uVar3;
  if ((this->super_BP5Engine).m_Parameters.DirectIO == true) {
    uVar4 = (this->super_BP5Engine).m_Parameters.DirectIOAlignOffset;
    uVar6 = (ulong)uVar4;
    uVar7 = (this->super_BP5Engine).m_Parameters.DirectIOAlignBuffer;
    if (uVar7 == 0) {
      (this->super_BP5Engine).m_Parameters.DirectIOAlignBuffer = uVar4;
      uVar7 = uVar4;
    }
    (this->m_BP5Serializer).m_BufferBlockSize = uVar6;
    (this->m_BP5Serializer).m_BufferAlign = (ulong)uVar7;
    if (uVar3 % uVar4 != 0) {
      (this->super_BP5Engine).m_Parameters.StripeSize = (uVar3 / uVar4 + 1) * uVar4;
    }
    uVar2 = (this->super_BP5Engine).m_Parameters.BufferChunkSize;
    if (uVar2 % uVar6 != 0) {
      (this->super_BP5Engine).m_Parameters.BufferChunkSize = (uVar2 / uVar6 + 1) * uVar6;
    }
  }
  (this->m_BP5Serializer).m_StatsLevel = (this->super_BP5Engine).m_Parameters.StatsLevel;
  return;
}

Assistant:

void BP5Writer::InitParameters()
{
    ParseParams(m_IO, m_Parameters);
    m_WriteToBB = !(m_Parameters.BurstBufferPath.empty());
    m_DrainBB = m_WriteToBB && m_Parameters.BurstBufferDrain;

    unsigned int nproc = (unsigned int)m_Comm.Size();
    m_Parameters.NumAggregators = helper::SetWithinLimit(m_Parameters.NumAggregators, 0U, nproc);
    m_Parameters.NumSubFiles = helper::SetWithinLimit(m_Parameters.NumSubFiles, 0U, nproc);
    m_Parameters.AggregatorRatio = helper::SetWithinLimit(m_Parameters.AggregatorRatio, 0U, nproc);
    if (m_Parameters.NumAggregators == 0)
    {
        if (m_Parameters.AggregatorRatio > 0)
        {
            m_Parameters.NumAggregators =
                helper::SetWithinLimit(nproc / m_Parameters.AggregatorRatio, 0U, nproc);
        }
        else if (m_Parameters.NumSubFiles > 0)
        {
            m_Parameters.NumAggregators =
                helper::SetWithinLimit(m_Parameters.NumSubFiles, 0U, nproc);
        }
    }
    m_Parameters.NumSubFiles =
        helper::SetWithinLimit(m_Parameters.NumSubFiles, 0U, m_Parameters.NumAggregators);

    // Limiting to max 64MB page size
    m_Parameters.StripeSize = helper::SetWithinLimit(m_Parameters.StripeSize, 0U, 67108864U);
    if (m_Parameters.StripeSize == 0)
    {
        m_Parameters.StripeSize = 4096;
    }

    if (m_Parameters.DirectIO)
    {
        if (m_Parameters.DirectIOAlignBuffer == 0)
        {
            m_Parameters.DirectIOAlignBuffer = m_Parameters.DirectIOAlignOffset;
        }
        m_BP5Serializer.m_BufferBlockSize = m_Parameters.DirectIOAlignOffset;
        m_BP5Serializer.m_BufferAlign = m_Parameters.DirectIOAlignBuffer;
        if (m_Parameters.StripeSize % m_Parameters.DirectIOAlignOffset)
        {
            size_t k = m_Parameters.StripeSize / m_Parameters.DirectIOAlignOffset + 1;
            m_Parameters.StripeSize = (unsigned int)(k * m_Parameters.DirectIOAlignOffset);
        }
        if (m_Parameters.BufferChunkSize % m_Parameters.DirectIOAlignOffset)
        {
            size_t k = m_Parameters.BufferChunkSize / m_Parameters.DirectIOAlignOffset + 1;
            m_Parameters.BufferChunkSize = k * m_Parameters.DirectIOAlignOffset;
        }
    }

    m_BP5Serializer.m_StatsLevel = m_Parameters.StatsLevel;
}